

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall ManifestParser::ParseEdge(ManifestParser *this,string *err)

{
  pointer *pppVar1;
  State *pSVar2;
  bool bVar3;
  Edge *this_00;
  ulong uVar4;
  vector<Node_*,_std::allocator<Node_*>_> *pvVar5;
  size_type sVar6;
  reference this_01;
  undefined8 uVar7;
  pointer pEVar8;
  reference ppNVar9;
  Node *pNVar10;
  BindingEnv *local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_4f8;
  Node **local_4f0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_4e8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_4e0;
  iterator dgi;
  uint64_t local_4c8;
  uint64_t slash_bits_3;
  string dyndep;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_498;
  const_iterator local_490;
  const_iterator local_488;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_480;
  Node **local_478;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_470;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_468;
  iterator new_end;
  Node *out_2;
  uint64_t local_448;
  uint64_t slash_bits_2;
  string local_438;
  undefined1 local_418 [8];
  string path_2;
  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_> local_3f0;
  iterator v;
  uint64_t local_3d8;
  uint64_t slash_bits_1;
  string local_3c8;
  undefined1 local_3a8 [8];
  string path_1;
  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_> local_380;
  iterator i_1;
  StringPiece local_358;
  uint64_t local_348;
  uint64_t slash_bits;
  string local_338;
  undefined1 local_318 [8];
  string path;
  size_t e;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  Pool *local_2a8;
  Pool *pool;
  string local_298;
  undefined1 local_278 [8];
  string pool_name;
  Edge *edge;
  undefined1 local_230 [8];
  EvalString val;
  string key;
  BindingEnv *env;
  undefined1 local_1d8 [7];
  bool has_indent_token;
  EvalString validation;
  EvalString in_2;
  undefined1 local_1a0 [4];
  int order_only;
  EvalString in_1;
  undefined1 local_180 [4];
  int implicit;
  EvalString in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  Rule *local_128;
  Rule *rule;
  string local_118;
  undefined1 local_f8 [8];
  string rule_name;
  string local_d0;
  undefined1 local_b0 [8];
  EvalString out_1;
  int local_90;
  int implicit_outs;
  undefined1 local_80 [8];
  EvalString out;
  vector<EvalString,_std::allocator<EvalString>_> validations;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  string *err_local;
  ManifestParser *this_local;
  
  std::vector<EvalString,_std::allocator<EvalString>_>::vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<EvalString,_std::allocator<EvalString>_>::vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<EvalString,_std::allocator<EvalString>_>::vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  EvalString::EvalString((EvalString *)local_80);
  bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_80,err);
  if (bVar3) {
    do {
      bVar3 = EvalString::empty((EvalString *)local_80);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        bVar3 = false;
        goto LAB_0013c65b;
      }
      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                ((vector<EvalString,_std::allocator<EvalString>_> *)
                 &validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)local_80);
      EvalString::Clear((EvalString *)local_80);
      bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_80,err);
    } while (bVar3);
    this_local._7_1_ = 0;
    bVar3 = true;
  }
  else {
    this_local._7_1_ = 0;
    bVar3 = true;
  }
LAB_0013c65b:
  EvalString::~EvalString((EvalString *)local_80);
  if (bVar3) goto LAB_0013e0fe;
  out_1.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
  if (bVar3) {
    do {
      EvalString::EvalString((EvalString *)local_b0);
      bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_b0,err);
      if (bVar3) {
        bVar3 = EvalString::empty((EvalString *)local_b0);
        if (bVar3) {
          local_90 = 4;
        }
        else {
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_b0);
          out_1.parsed_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               out_1.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          local_90 = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
        local_90 = 1;
      }
      EvalString::~EvalString((EvalString *)local_b0);
    } while (local_90 == 0);
    if (local_90 != 4) goto LAB_0013e0fe;
  }
  bVar3 = std::vector<EvalString,_std::allocator<EvalString>_>::empty
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"expected path",
               (allocator<char> *)(rule_name.field_2._M_local_buf + 0xf));
    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_d0,err);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(rule_name.field_2._M_local_buf + 0xf));
    goto LAB_0013e0fe;
  }
  bVar3 = Parser::ExpectToken(&this->super_Parser,COLON,err);
  if (!bVar3) {
    this_local._7_1_ = 0;
    goto LAB_0013e0fe;
  }
  std::__cxx11::string::string((string *)local_f8);
  bVar3 = Lexer::ReadIdent(&(this->super_Parser).lexer_,(string *)local_f8);
  if (bVar3) {
    local_128 = BindingEnv::LookupRule(this->env_,(string *)local_f8);
    if (local_128 == (Rule *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &in.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"unknown build rule \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::operator+(&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &in.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"\'");
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_148,err);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string
                ((string *)
                 &in.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      do {
        EvalString::EvalString((EvalString *)local_180);
        bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_180,err);
        if (bVar3) {
          bVar3 = EvalString::empty((EvalString *)local_180);
          if (bVar3) {
            local_90 = 6;
          }
          else {
            std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                      ((vector<EvalString,_std::allocator<EvalString>_> *)
                       &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type *)local_180);
            local_90 = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
          local_90 = 1;
        }
        EvalString::~EvalString((EvalString *)local_180);
      } while (local_90 == 0);
      if (local_90 == 6) {
        in_1.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
        if (bVar3) {
          do {
            EvalString::EvalString((EvalString *)local_1a0);
            bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_1a0,err);
            if (bVar3) {
              bVar3 = EvalString::empty((EvalString *)local_1a0);
              if (bVar3) {
                local_90 = 8;
              }
              else {
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          ((vector<EvalString,_std::allocator<EvalString>_> *)
                           &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage,(value_type *)local_1a0);
                in_1.parsed_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     in_1.parsed_.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
                local_90 = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_90 = 1;
            }
            EvalString::~EvalString((EvalString *)local_1a0);
          } while (local_90 == 0);
          if (local_90 != 8) goto LAB_0013e0e2;
        }
        in_2.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE2);
        if (bVar3) {
          do {
            pppVar1 = &validation.parsed_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            EvalString::EvalString((EvalString *)pppVar1);
            bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)pppVar1,err);
            if (bVar3) {
              bVar3 = EvalString::empty((EvalString *)
                                        &validation.parsed_.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar3) {
                local_90 = 10;
              }
              else {
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          ((vector<EvalString,_std::allocator<EvalString>_> *)
                           &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage,
                           (value_type *)
                           &validation.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                in_2.parsed_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     in_2.parsed_.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
                local_90 = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_90 = 1;
            }
            EvalString::~EvalString
                      ((EvalString *)
                       &validation.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          } while (local_90 == 0);
          if (local_90 != 10) goto LAB_0013e0e2;
        }
        bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPEAT);
        if (bVar3) {
          do {
            EvalString::EvalString((EvalString *)local_1d8);
            bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_1d8,err);
            if (bVar3) {
              bVar3 = EvalString::empty((EvalString *)local_1d8);
              if (bVar3) {
                local_90 = 0xc;
              }
              else {
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          ((vector<EvalString,_std::allocator<EvalString>_> *)
                           &out.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (value_type *)local_1d8);
                local_90 = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_90 = 1;
            }
            EvalString::~EvalString((EvalString *)local_1d8);
          } while (local_90 == 0);
          if (local_90 != 0xc) goto LAB_0013e0e2;
        }
        bVar3 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
        if (bVar3) {
          env._7_1_ = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
          if (env._7_1_) {
            local_628 = (BindingEnv *)operator_new(0x70);
            BindingEnv::BindingEnv(local_628,this->env_);
          }
          else {
            local_628 = this->env_;
          }
          do {
            if (env._7_1_ == false) {
              this_00 = State::AddEdge((this->super_Parser).state_,local_128);
              this_00->env_ = local_628;
              pool_name.field_2._8_8_ = this_00;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_298,"pool",(allocator<char> *)((long)&pool + 7));
              Edge::GetBinding((string *)local_278,this_00,&local_298);
              std::__cxx11::string::~string((string *)&local_298);
              std::allocator<char>::~allocator((allocator<char> *)((long)&pool + 7));
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                local_2a8 = State::LookupPool((this->super_Parser).state_,(string *)local_278);
                if (local_2a8 == (Pool *)0x0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i,"unknown pool name \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_278);
                  std::operator+(&local_2c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i,"\'");
                  this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_2c8,err);
                  std::__cxx11::string::~string((string *)&local_2c8);
                  std::__cxx11::string::~string((string *)&i);
                  goto LAB_0013e0c6;
                }
                *(Pool **)(pool_name.field_2._8_8_ + 8) = local_2a8;
              }
              pvVar5 = (vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x28);
              sVar6 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                                ((vector<EvalString,_std::allocator<EvalString>_> *)
                                 &validations.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<Node_*,_std::allocator<Node_*>_>::reserve(pvVar5,sVar6);
              e = 0;
              path.field_2._8_8_ =
                   std::vector<EvalString,_std::allocator<EvalString>_>::size
                             ((vector<EvalString,_std::allocator<EvalString>_> *)
                              &validations.
                               super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
              goto LAB_0013d4a0;
            }
            pppVar1 = &val.parsed_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::string((string *)pppVar1);
            EvalString::EvalString((EvalString *)local_230);
            bVar3 = ParseLet(this,(string *)pppVar1,(EvalString *)local_230,err);
            if (bVar3) {
              EvalString::Evaluate_abi_cxx11_
                        ((string *)&edge,(EvalString *)local_230,&this->env_->super_Env);
              BindingEnv::AddBinding
                        (local_628,
                         (string *)
                         &val.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&edge);
              std::__cxx11::string::~string((string *)&edge);
              env._7_1_ = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
            }
            else {
              this_local._7_1_ = 0;
            }
            EvalString::~EvalString((EvalString *)local_230);
            std::__cxx11::string::~string
                      ((string *)
                       &val.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          } while (bVar3);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"expected build command name",
               (allocator<char> *)((long)&rule + 7));
    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_118,err);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rule + 7));
  }
LAB_0013e0e2:
  std::__cxx11::string::~string((string *)local_f8);
LAB_0013e0fe:
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
LAB_0013d4a0:
  if (e == path.field_2._8_8_) goto LAB_0013d7a0;
  this_01 = std::vector<EvalString,_std::allocator<EvalString>_>::operator[]
                      ((vector<EvalString,_std::allocator<EvalString>_> *)
                       &validations.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,e);
  EvalString::Evaluate_abi_cxx11_((string *)local_318,this_01,&local_628->super_Env);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    CanonicalizePath((string *)local_318,&local_348);
    uVar7 = pool_name.field_2._8_8_;
    pSVar2 = (this->super_Parser).state_;
    StringPiece::StringPiece(&local_358,(string *)local_318);
    bVar3 = State::AddOut(pSVar2,(Edge *)uVar7,local_358,local_348);
    if (!bVar3) {
      if (*(int *)&this->options_ == 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                       "multiple rules generate ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_318);
        Lexer::Error(&(this->super_Parser).lexer_,(string *)&i_1,err);
        std::__cxx11::string::~string((string *)&i_1);
        this_local._7_1_ = 0;
        bVar3 = true;
        goto LAB_0013d75a;
      }
      if ((this->quiet_ & 1U) == 0) {
        uVar7 = std::__cxx11::string::c_str();
        Warning("multiple rules generate %s. builds involving this target will not be correct; continuing anyway"
                ,uVar7);
      }
      if (path.field_2._8_8_ - e <=
          (ulong)(long)out_1.parsed_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        out_1.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             out_1.parsed_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
      }
    }
    bVar3 = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"empty path",(allocator<char> *)((long)&slash_bits + 7));
    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_338,err);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator((allocator<char> *)((long)&slash_bits + 7));
    bVar3 = true;
  }
LAB_0013d75a:
  std::__cxx11::string::~string((string *)local_318);
  if (bVar3) goto LAB_0013e0c6;
  e = e + 1;
  goto LAB_0013d4a0;
LAB_0013d7a0:
  bVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                    ((vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x28));
  if (bVar3) {
    std::vector<Edge_*,_std::allocator<Edge_*>_>::pop_back(&((this->super_Parser).state_)->edges_);
    uVar7 = pool_name.field_2._8_8_;
    if (pool_name.field_2._8_8_ != 0) {
      Edge::~Edge((Edge *)pool_name.field_2._8_8_);
      operator_delete((void *)uVar7,0x88);
    }
    this_local._7_1_ = 1;
  }
  else {
    *(int *)(pool_name.field_2._8_8_ + 0x84) =
         out_1.parsed_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar5 = (vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x10);
    sVar6 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                      ((vector<EvalString,_std::allocator<EvalString>_> *)
                       &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<Node_*,_std::allocator<Node_*>_>::reserve(pvVar5,sVar6);
    local_380._M_current =
         (EvalString *)
         std::vector<EvalString,_std::allocator<EvalString>_>::begin
                   ((vector<EvalString,_std::allocator<EvalString>_> *)
                    &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      path_1.field_2._8_8_ =
           std::vector<EvalString,_std::allocator<EvalString>_>::end
                     ((vector<EvalString,_std::allocator<EvalString>_> *)
                      &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=
                        (&local_380,
                         (__normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                          *)((long)&path_1.field_2 + 8));
      if (!bVar3) break;
      pEVar8 = __gnu_cxx::
               __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
               ::operator->(&local_380);
      EvalString::Evaluate_abi_cxx11_((string *)local_3a8,pEVar8,&local_628->super_Env);
      uVar4 = std::__cxx11::string::empty();
      bVar3 = (uVar4 & 1) != 0;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"empty path",(allocator<char> *)((long)&slash_bits_1 + 7));
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_3c8,err);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&slash_bits_1 + 7));
      }
      else {
        CanonicalizePath((string *)local_3a8,&local_3d8);
        uVar7 = pool_name.field_2._8_8_;
        pSVar2 = (this->super_Parser).state_;
        StringPiece::StringPiece((StringPiece *)&v,(string *)local_3a8);
        State::AddIn(pSVar2,(Edge *)uVar7,_v,local_3d8);
      }
      std::__cxx11::string::~string((string *)local_3a8);
      if (bVar3) goto LAB_0013e0c6;
      __gnu_cxx::
      __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>::
      operator++(&local_380);
    }
    *(int *)(pool_name.field_2._8_8_ + 0x7c) =
         in_1.parsed_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(int *)(pool_name.field_2._8_8_ + 0x80) =
         in_2.parsed_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar5 = (vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x40);
    sVar6 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                      ((vector<EvalString,_std::allocator<EvalString>_> *)
                       &out.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<Node_*,_std::allocator<Node_*>_>::reserve(pvVar5,sVar6);
    local_3f0._M_current =
         (EvalString *)
         std::vector<EvalString,_std::allocator<EvalString>_>::begin
                   ((vector<EvalString,_std::allocator<EvalString>_> *)
                    &out.parsed_.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      path_2.field_2._8_8_ =
           std::vector<EvalString,_std::allocator<EvalString>_>::end
                     ((vector<EvalString,_std::allocator<EvalString>_> *)
                      &out.parsed_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=
                        (&local_3f0,
                         (__normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                          *)((long)&path_2.field_2 + 8));
      if (!bVar3) break;
      pEVar8 = __gnu_cxx::
               __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
               ::operator->(&local_3f0);
      EvalString::Evaluate_abi_cxx11_((string *)local_418,pEVar8,&local_628->super_Env);
      uVar4 = std::__cxx11::string::empty();
      bVar3 = (uVar4 & 1) != 0;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"empty path",(allocator<char> *)((long)&slash_bits_2 + 7));
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_438,err);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator((allocator<char> *)((long)&slash_bits_2 + 7));
      }
      else {
        CanonicalizePath((string *)local_418,&local_448);
        uVar7 = pool_name.field_2._8_8_;
        pSVar2 = (this->super_Parser).state_;
        StringPiece::StringPiece((StringPiece *)&out_2,(string *)local_418);
        State::AddValidation(pSVar2,(Edge *)uVar7,_out_2,local_448);
      }
      std::__cxx11::string::~string((string *)local_418);
      if (bVar3) goto LAB_0013e0c6;
      __gnu_cxx::
      __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>::
      operator++(&local_3f0);
    }
    if ((*(int *)&this->field_0x54 == 0) &&
       (bVar3 = Edge::maybe_phonycycle_diagnostic((Edge *)pool_name.field_2._8_8_), bVar3)) {
      ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           (pool_name.field_2._8_8_ + 0x28),0);
      new_end._M_current = (Node **)*ppNVar9;
      local_470._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (pool_name.field_2._8_8_ + 0x10));
      local_478 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                     ((vector<Node_*,_std::allocator<Node_*>_> *)
                                      (pool_name.field_2._8_8_ + 0x10));
      local_468 = std::
                  remove<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,Node*>
                            (local_470,
                             (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                              )local_478,(Node **)&new_end);
      local_480._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (pool_name.field_2._8_8_ + 0x10));
      bVar3 = __gnu_cxx::operator!=(&local_468,&local_480);
      if (bVar3) {
        pvVar5 = (vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x10);
        __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
        __normal_iterator<Node**>
                  ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                   &local_488,&local_468);
        local_498._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 (pool_name.field_2._8_8_ + 0x10));
        __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
        __normal_iterator<Node**>
                  ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                   &local_490,&local_498);
        dyndep.field_2._8_8_ =
             std::vector<Node_*,_std::allocator<Node_*>_>::erase(pvVar5,local_488,local_490);
        if ((this->quiet_ & 1U) == 0) {
          Node::path_abi_cxx11_((Node *)new_end._M_current);
          uVar7 = std::__cxx11::string::c_str();
          Warning("phony target \'%s\' names itself as an input; ignoring [-w phonycycle=warn]",
                  uVar7);
        }
      }
    }
    Edge::GetUnescapedDyndep_abi_cxx11_((string *)&slash_bits_3,(Edge *)pool_name.field_2._8_8_);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      CanonicalizePath((string *)&slash_bits_3,&local_4c8);
      pSVar2 = (this->super_Parser).state_;
      StringPiece::StringPiece((StringPiece *)&dgi,(string *)&slash_bits_3);
      pNVar10 = State::GetNode(pSVar2,_dgi,local_4c8);
      *(Node **)(pool_name.field_2._8_8_ + 0x58) = pNVar10;
      Node::set_dyndep_pending(*(Node **)(pool_name.field_2._8_8_ + 0x58),true);
      local_4e8._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (pool_name.field_2._8_8_ + 0x10));
      local_4f0 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                     ((vector<Node_*,_std::allocator<Node_*>_> *)
                                      (pool_name.field_2._8_8_ + 0x10));
      local_4e0 = std::
                  find<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,Node*>
                            (local_4e8,
                             (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                              )local_4f0,(Node **)(pool_name.field_2._8_8_ + 0x58));
      local_4f8._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (pool_name.field_2._8_8_ + 0x10));
      bVar3 = __gnu_cxx::operator==(&local_4e0,&local_4f8);
      if (!bVar3) goto LAB_0013e09c;
      std::operator+(&local_538,"dyndep \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &slash_bits_3);
      std::operator+(&local_518,&local_538,"\' is not an input");
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_518,err);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_538);
    }
    else {
LAB_0013e09c:
      this_local._7_1_ = true;
    }
    std::__cxx11::string::~string((string *)&slash_bits_3);
  }
LAB_0013e0c6:
  std::__cxx11::string::~string((string *)local_278);
  goto LAB_0013e0e2;
}

Assistant:

bool ManifestParser::ParseEdge(string* err) {
  vector<EvalString> ins, outs, validations;

  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    while (!out.empty()) {
      outs.push_back(out);

      out.Clear();
      if (!lexer_.ReadPath(&out, err))
        return false;
    }
  }

  // Add all implicit outs, counting how many as we go.
  int implicit_outs = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return false;
      if (out.empty())
        break;
      outs.push_back(out);
      ++implicit_outs;
    }
  }

  if (outs.empty())
    return lexer_.Error("expected path", err);

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name))
    return lexer_.Error("expected build command name", err);

  const Rule* rule = env_->LookupRule(rule_name);
  if (!rule)
    return lexer_.Error("unknown build rule '" + rule_name + "'", err);

  for (;;) {
    // XXX should we require one path here?
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (in.empty())
      break;
    ins.push_back(in);
  }

  // Add all implicit deps, counting how many as we go.
  int implicit = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++implicit;
    }
  }

  // Add all order-only deps, counting how many as we go.
  int order_only = 0;
  if (lexer_.PeekToken(Lexer::PIPE2)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++order_only;
    }
  }

  // Add all validations, counting how many as we go.
  if (lexer_.PeekToken(Lexer::PIPEAT)) {
    for (;;) {
      EvalString validation;
      if (!lexer_.ReadPath(&validation, err))
        return false;
      if (validation.empty())
        break;
      validations.push_back(validation);
    }
  }

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  // Bindings on edges are rare, so allocate per-edge envs only when needed.
  bool has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  BindingEnv* env = has_indent_token ? new BindingEnv(env_) : env_;
  while (has_indent_token) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;

    env->AddBinding(key, val.Evaluate(env_));
    has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  }

  Edge* edge = state_->AddEdge(rule);
  edge->env_ = env;

  string pool_name = edge->GetBinding("pool");
  if (!pool_name.empty()) {
    Pool* pool = state_->LookupPool(pool_name);
    if (pool == NULL)
      return lexer_.Error("unknown pool name '" + pool_name + "'", err);
    edge->pool_ = pool;
  }

  edge->outputs_.reserve(outs.size());
  for (size_t i = 0, e = outs.size(); i != e; ++i) {
    string path = outs[i].Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    if (!state_->AddOut(edge, path, slash_bits)) {
      if (options_.dupe_edge_action_ == kDupeEdgeActionError) {
        lexer_.Error("multiple rules generate " + path, err);
        return false;
      } else {
        if (!quiet_) {
          Warning(
              "multiple rules generate %s. builds involving this target will "
              "not be correct; continuing anyway",
              path.c_str());
        }
        if (e - i <= static_cast<size_t>(implicit_outs))
          --implicit_outs;
      }
    }
  }

  if (edge->outputs_.empty()) {
    // All outputs of the edge are already created by other edges. Don't add
    // this edge.  Do this check before input nodes are connected to the edge.
    state_->edges_.pop_back();
    delete edge;
    return true;
  }
  edge->implicit_outs_ = implicit_outs;

  edge->inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddIn(edge, path, slash_bits);
  }
  edge->implicit_deps_ = implicit;
  edge->order_only_deps_ = order_only;

  edge->validations_.reserve(validations.size());
  for (std::vector<EvalString>::iterator v = validations.begin();
      v != validations.end(); ++v) {
    string path = v->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddValidation(edge, path, slash_bits);
  }

  if (options_.phony_cycle_action_ == kPhonyCycleActionWarn &&
      edge->maybe_phonycycle_diagnostic()) {
    // CMake 2.8.12.x and 3.0.x incorrectly write phony build statements
    // that reference themselves.  Ninja used to tolerate these in the
    // build graph but that has since been fixed.  Filter them out to
    // support users of those old CMake versions.
    Node* out = edge->outputs_[0];
    vector<Node*>::iterator new_end =
        remove(edge->inputs_.begin(), edge->inputs_.end(), out);
    if (new_end != edge->inputs_.end()) {
      edge->inputs_.erase(new_end, edge->inputs_.end());
      if (!quiet_) {
        Warning("phony target '%s' names itself as an input; "
                "ignoring [-w phonycycle=warn]",
                out->path().c_str());
      }
    }
  }

  // Lookup, validate, and save any dyndep binding.  It will be used later
  // to load generated dependency information dynamically, but it must
  // be one of our manifest-specified inputs.
  string dyndep = edge->GetUnescapedDyndep();
  if (!dyndep.empty()) {
    uint64_t slash_bits;
    CanonicalizePath(&dyndep, &slash_bits);
    edge->dyndep_ = state_->GetNode(dyndep, slash_bits);
    edge->dyndep_->set_dyndep_pending(true);
    vector<Node*>::iterator dgi =
      std::find(edge->inputs_.begin(), edge->inputs_.end(), edge->dyndep_);
    if (dgi == edge->inputs_.end()) {
      return lexer_.Error("dyndep '" + dyndep + "' is not an input", err);
    }
  }

  return true;
}